

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Wizard.cxx
# Opt level: O0

void __thiscall Fl_Wizard::draw(Fl_Wizard *this)

{
  byte bVar1;
  Fl_Boxtype FVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Fl_Color FVar7;
  Fl_Widget *widget;
  Fl_Widget *kid;
  Fl_Wizard *this_local;
  
  widget = value(this);
  bVar1 = Fl_Widget::damage((Fl_Widget *)this);
  if ((bVar1 & 0x80) == 0) {
    if (widget != (Fl_Widget *)0x0) {
      Fl_Group::update_child(&this->super_Fl_Group,widget);
    }
  }
  else if (widget == (Fl_Widget *)0x0) {
    FVar2 = Fl_Widget::box((Fl_Widget *)this);
    iVar3 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    iVar5 = Fl_Widget::w((Fl_Widget *)this);
    iVar6 = Fl_Widget::h((Fl_Widget *)this);
    FVar7 = Fl_Widget::color((Fl_Widget *)this);
    Fl_Widget::draw_box((Fl_Widget *)this,FVar2,iVar3,iVar4,iVar5,iVar6,FVar7);
  }
  else {
    FVar2 = Fl_Widget::box((Fl_Widget *)this);
    iVar3 = Fl_Widget::x((Fl_Widget *)this);
    iVar4 = Fl_Widget::y((Fl_Widget *)this);
    iVar5 = Fl_Widget::w((Fl_Widget *)this);
    iVar6 = Fl_Widget::h((Fl_Widget *)this);
    FVar7 = Fl_Widget::color(widget);
    Fl_Widget::draw_box((Fl_Widget *)this,FVar2,iVar3,iVar4,iVar5,iVar6,FVar7);
    Fl_Group::draw_child(&this->super_Fl_Group,widget);
  }
  return;
}

Assistant:

void Fl_Wizard::draw() {
  Fl_Widget	*kid;	// Visible child


  kid = value();

  if (damage() & FL_DAMAGE_ALL)
  {
    // Redraw everything...
    if (kid)
    {
      draw_box(box(), x(), y(), w(), h(), kid->color());
      draw_child(*kid);
    }
    else
      draw_box(box(), x(), y(), w(), h(), color());

  }
  else if (kid)
    update_child(*kid);
}